

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  TargetType TVar2;
  char *pcVar3;
  ostream *poVar4;
  uint uVar5;
  cmGlobalGenerator *this_00;
  pointer ppcVar6;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  string fname;
  cmGeneratedFileStream fout;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_2d0;
  char *local_2b8 [4];
  string local_298;
  cmGeneratedFileStream local_278;
  
  pcVar3 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_2b8,pcVar3,(allocator *)&local_278);
  std::__cxx11::string::append((char *)local_2b8);
  std::__cxx11::string::append((char *)local_2b8);
  uVar5 = 0;
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,local_2b8[0],false,None);
  while( true ) {
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
        (ulong)uVar5) break;
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_2d0,
               &ppcVar1[uVar5]->GeneratorTargets);
    for (ppcVar6 = local_2d0._M_impl.super__Vector_impl_data._M_start;
        ppcVar6 != local_2d0._M_impl.super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
      this_00 = (cmGlobalGenerator *)*ppcVar6;
      TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00);
      if (TVar2 != INTERFACE_LIBRARY) {
        WriteSummary(this_00,*ppcVar6);
        cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_298,*ppcVar6);
        poVar4 = std::operator<<((ostream *)&local_278,(string *)&local_298);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&local_298);
      }
    }
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_2d0);
    uVar5 = uVar5 + 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  std::__cxx11::string::~string((string *)local_2b8);
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  // Record all target directories in a central location.
  std::string fname = this->CMakeInstance->GetHomeOutputDirectory();
  fname += cmake::GetCMakeFilesDirectory();
  fname += "/TargetDirectories.txt";
  cmGeneratedFileStream fout(fname.c_str());

  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    std::vector<cmGeneratorTarget*> tgts =
      this->LocalGenerators[i]->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator it = tgts.begin();
         it != tgts.end(); ++it) {
      if ((*it)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->WriteSummary(*it);
      fout << (*it)->GetSupportDirectory() << "\n";
    }
  }
}